

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

void Unit_exponent(int val)

{
  double dVar1;
  int in_EDI;
  double d;
  int i;
  int local_8;
  
  if (UnitsOn != 0) {
    if (usp < unit_stack) {
      __assert_fail("usp >= unit_stack",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/units.c"
                    ,0x149,"void Unit_exponent()");
    }
    for (local_8 = 0; local_8 < 10; local_8 = local_8 + 1) {
      usp->dim[local_8] = usp->dim[local_8] * (char)in_EDI;
    }
    dVar1 = usp->factor;
    for (local_8 = 1; local_8 < in_EDI; local_8 = local_8 + 1) {
      usp->factor = dVar1 * usp->factor;
    }
  }
  return;
}

Assistant:

void Unit_exponent(val)
	int val;
{
	/* multiply top of stack by val and leave on stack */
	int i;
	double d;
	
	IFUNITS
	assert(usp >= unit_stack);
	for (i=0; i<NDIM; i++) {
		usp->dim[i] *= val;
	}
	d = usp->factor;
	for (i=1; i<val; i++) {
		usp->factor *= d;
	}
}